

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unittest_proto3.pb.h
# Opt level: O2

TestAllTypes_NestedMessage * __thiscall
proto3_unittest::TestAllTypes::_internal_mutable_optional_lazy_message(TestAllTypes *this)

{
  TestAllTypes_NestedMessage *pTVar1;
  Arena *arena;
  
  pTVar1 = (this->field_0)._impl_.optional_lazy_message_;
  if (pTVar1 != (TestAllTypes_NestedMessage *)0x0) {
    return pTVar1;
  }
  arena = (Arena *)(this->super_Message).super_MessageLite._internal_metadata_.ptr_;
  if (((ulong)arena & 1) != 0) {
    arena = *(Arena **)((ulong)arena & 0xfffffffffffffffe);
  }
  pTVar1 = (TestAllTypes_NestedMessage *)
           google::protobuf::Arena::DefaultConstruct<proto3_unittest::TestAllTypes_NestedMessage>
                     (arena);
  (this->field_0)._impl_.optional_lazy_message_ = pTVar1;
  return pTVar1;
}

Assistant:

inline ::proto3_unittest::TestAllTypes_NestedMessage* PROTOBUF_NONNULL TestAllTypes::_internal_mutable_optional_lazy_message() {
  ::google::protobuf::internal::TSanWrite(&_impl_);
  if (_impl_.optional_lazy_message_ == nullptr) {
    auto* p = ::google::protobuf::Message::DefaultConstruct<::proto3_unittest::TestAllTypes_NestedMessage>(GetArena());
    _impl_.optional_lazy_message_ = reinterpret_cast<::proto3_unittest::TestAllTypes_NestedMessage*>(p);
  }
  return _impl_.optional_lazy_message_;
}